

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarClassic.cpp
# Opt level: O0

PartialPolicyPoolItemInterface_sharedPtr __thiscall
GMAA_MAAstarClassic::NewPPI(GMAA_MAAstarClassic *this,PJPDP_sharedPtr *jp,double v)

{
  PartialJPDPValuePair *this_00;
  shared_count extraout_RDX;
  PJPDP_sharedPtr *in_RDI;
  PartialPolicyPoolItemInterface_sharedPtr PVar1;
  PartialPolicyPoolItemInterface_sharedPtr *ppi;
  PJPDP_sharedPtr *jp_00;
  PartialJPDPValuePair *in_stack_ffffffffffffffc8;
  shared_ptr<PartialPolicyPoolItemInterface> *in_stack_ffffffffffffffd0;
  
  jp_00 = in_RDI;
  this_00 = (PartialJPDPValuePair *)operator_new(0x60);
  PartialJPDPValuePair::PartialJPDPValuePair(this_00,jp_00,(double)in_RDI);
  boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr<PartialJPDPValuePair>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  PVar1.pn.pi_ = extraout_RDX.pi_;
  PVar1.px = (element_type *)jp_00;
  return PVar1;
}

Assistant:

PartialPolicyPoolItemInterface_sharedPtr
GMAA_MAAstarClassic::NewPPI(const PJPDP_sharedPtr &jp, double v) const
{
    //NOTE: this conversion to an index does save a lot of space, so
    //if we can enable this again would be better.
    //PartialPolicyPoolItemInterface* ppi=new JPPVIndexValPair(jp,v);
    //delete jp;
    PartialPolicyPoolItemInterface_sharedPtr ppi=
        PartialPolicyPoolItemInterface_sharedPtr(new PartialJPDPValuePair(jp,v));
    return (ppi);
}